

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

void __thiscall CDT::compile(CDT *this,uint n_layer)

{
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  Shape SVar4;
  uint local_34;
  uint i;
  uint uStack_1c;
  uint n_layer_local;
  CDT *this_local;
  
  std::vector<Layer,_std::allocator<Layer>_>::resize(&this->m_layers,(ulong)n_layer);
  pvVar1 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
  SVar4 = Matrix<double>::shape(&this->m_input);
  uStack_1c = SVar4.n_col;
  Layer::add_perceptron(pvVar1,uStack_1c - 1);
  local_34 = 0;
  while( true ) {
    sVar2 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
    if (sVar2 - 1 <= (ulong)local_34) break;
    pvVar1 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,(ulong)local_34)
    ;
    pvVar3 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)(local_34 + 1));
    Layer::compile(pvVar1,(pvVar3->m_shape).n_col);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void CDT::compile(unsigned n_layer){
    m_layers.resize(n_layer);
    
    m_layers[0].add_perceptron(m_input.shape().n_col-1);
    for(unsigned i=0;i<m_layers.size()-1;++i){
        m_layers[i].compile(m_layers[i+1].m_shape.n_col);
    }
}